

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.hpp
# Opt level: O1

void __thiscall Tree::destroyRecursive(Tree *this,Vertex **root)

{
  Vertex *pVVar1;
  pointer prVar2;
  
  if (*root != (Vertex *)0x0) {
    destroyRecursive(this,&(*root)->ptrLeft);
    destroyRecursive(this,&(*root)->ptrRight);
    pVVar1 = *root;
    if (pVVar1 != (Vertex *)0x0) {
      prVar2 = (pVVar1->data).super__Vector_base<record,_std::allocator<record>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (prVar2 != (pointer)0x0) {
        operator_delete(prVar2,(long)(pVVar1->data).
                                     super__Vector_base<record,_std::allocator<record>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage - (long)prVar2);
      }
      operator_delete(pVVar1,0x30);
      return;
    }
  }
  return;
}

Assistant:

void destroyRecursive(Vertex **root) {
        if (*root) {
            destroyRecursive(&((*root)->ptrLeft));
            destroyRecursive(&((*root)->ptrRight));
            delete *root;
        }
    }